

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall matchit::impl::Id<int>::matchValue<int_const&>(Id<int> *this,int *v)

{
  bool bVar1;
  int *lhs;
  IdBlockBase<int> *this_00;
  ValueVariant<int> *pVVar2;
  int *v_local;
  Id<int> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<int>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<int>;
    pVVar2 = IdBlockBase<int>::variant(this_00);
    IdUtil<int>::bindValue<int_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }